

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fiobj_str.c
# Opt level: O3

size_t fiobj_str_printf(FIOBJ dest,char *format,...)

{
  char in_AL;
  undefined8 in_RCX;
  undefined8 in_RDX;
  ulong uVar1;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  va_list argv;
  fio_str_info_s state;
  __va_list_tag local_e8;
  fio_str_info_s local_d0;
  undefined1 local_b8 [16];
  undefined8 local_a8;
  undefined8 local_a0;
  undefined8 local_98;
  undefined8 local_90;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  undefined8 local_38;
  undefined8 local_28;
  undefined8 local_18;
  
  if (in_AL != '\0') {
    local_88 = in_XMM0_Qa;
    local_78 = in_XMM1_Qa;
    local_68 = in_XMM2_Qa;
    local_58 = in_XMM3_Qa;
    local_48 = in_XMM4_Qa;
    local_38 = in_XMM5_Qa;
    local_28 = in_XMM6_Qa;
    local_18 = in_XMM7_Qa;
  }
  local_a8 = in_RDX;
  local_a0 = in_RCX;
  local_98 = in_R8;
  local_90 = in_R9;
  if (((uint)dest & 7) == 2) {
    uVar1 = dest & 0xfffffffffffffff8;
    if (*(char *)(uVar1 + 0x11) == '\0') {
      *(undefined8 *)(uVar1 + 8) = 0;
      local_e8.reg_save_area = local_b8;
      local_e8.overflow_arg_area = &argv[0].overflow_arg_area;
      local_e8.gp_offset = 0x10;
      local_e8.fp_offset = 0x30;
      fio_str_vprintf(&local_d0,(fio_str_s_conflict *)(uVar1 + 0x10),format,&local_e8);
    }
    else {
      local_d0.len = 0;
    }
    return local_d0.len;
  }
  __assert_fail("FIOBJ_TYPE_IS(dest, FIOBJ_T_STRING)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/1byte2bytes[P]LotteHTTP/facil.io-0.7.3/lib/facil/fiobj/fiobj_str.c"
                ,0x10f,"size_t fiobj_str_printf(FIOBJ, const char *, ...)");
}

Assistant:

size_t fiobj_str_printf(FIOBJ dest, const char *format, ...) {
  assert(FIOBJ_TYPE_IS(dest, FIOBJ_T_STRING));
  if (obj2str(dest)->str.frozen)
    return 0;
  obj2str(dest)->hash = 0;
  va_list argv;
  va_start(argv, format);
  fio_str_info_s state = fio_str_vprintf(&obj2str(dest)->str, format, argv);
  va_end(argv);
  return state.len;
}